

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffcb8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc0;
  AssertHelper *this_01;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc8;
  unsigned_long *lhs;
  char *in_stack_fffffffffffffcd0;
  char *rhs_expression;
  char *in_stack_fffffffffffffcd8;
  char *lhs_expression;
  int line;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  char *file;
  undefined8 in_stack_fffffffffffffce8;
  Type type;
  AssertHelper *in_stack_fffffffffffffcf0;
  AssertHelper *this_02;
  Message *in_stack_fffffffffffffd38;
  AssertHelper *in_stack_fffffffffffffd40;
  AssertionResult local_248 [2];
  size_type local_228;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffdf0;
  value_type *in_stack_fffffffffffffdf8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe08 [48];
  undefined1 auVar2 [32];
  undefined1 in_stack_fffffffffffffe38 [16];
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  nonempty_iterator in_stack_fffffffffffffe78;
  Message *pMStack_180;
  AssertHelper *local_178;
  undefined1 local_170 [80];
  undefined1 local_120 [8];
  AssertHelper *pAStack_118;
  unsigned_long *local_110;
  char *pcStack_108;
  char *local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  Type TStack_ec;
  AssertHelper *pAStack_e8;
  key_type local_c8;
  size_type local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  int local_9c;
  size_type local_98;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  for (local_14 = 10; local_14 < 2000; local_14 = local_14 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xec7500);
  }
  local_98 = google::
             BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xec754d);
  for (local_9c = 10; local_9c < 1000; local_9c = local_9c + 1) {
    local_b4 = 1;
    local_c8 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20)
                          );
    local_c0 = google::
               BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::erase(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,(uint *)in_stack_fffffffffffffcc8
               ,(unsigned_long *)in_stack_fffffffffffffcc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcf0);
      testing::AssertionResult::failure_message((AssertionResult *)0xec7623);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcf0,(Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                 (char *)in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 in_stack_fffffffffffffcd0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcc0);
      testing::Message::~Message((Message *)0xec7686);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xec76f1);
  }
  this_00 = (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(this_00);
  memcpy(local_120,local_170,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  memcpy(&stack0xfffffffffffffe48,&stack0xfffffffffffffdf8,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffdf8;
  f.ht = (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffdf0._M_head_impl;
  f.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe00;
  auVar2 = in_stack_fffffffffffffe08._16_32_;
  f.pos.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe08._0_8_;
  f.pos.col_current = (nonempty_iterator)in_stack_fffffffffffffe08._8_8_;
  f.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._0_8_;
  f.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._8_8_;
  f.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._16_8_;
  f.end.col_current = (nonempty_iterator)auVar2._24_8_;
  l.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe48;
  l.ht = (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe38._0_8_;
  l.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe38._8_8_;
  l.pos.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe50;
  l.pos.col_current = (nonempty_iterator)in_stack_fffffffffffffe58;
  l.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe60;
  l.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe68;
  l.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe70;
  l.end.col_current = in_stack_fffffffffffffe78;
  type = TStack_ec;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),f,l);
  local_228 = google::
              BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xec783c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_100,pcStack_108,(uint *)local_110,(unsigned_long *)pAStack_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffde8);
  this_01 = pAStack_118;
  lhs = local_110;
  rhs_expression = pcStack_108;
  lhs_expression = local_100;
  file = pcStack_f8;
  this_02 = pAStack_e8;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_e8);
    testing::AssertionResult::failure_message((AssertionResult *)0xec78a3);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_e8,type,pcStack_f8,(int)((ulong)local_100 >> 0x20),pcStack_108);
    testing::internal::AssertHelper::operator=(local_178,pMStack_180);
    testing::internal::AssertHelper::~AssertHelper(pAStack_118);
    testing::Message::~Message((Message *)0xec7906);
    this_01 = pAStack_118;
    lhs = local_110;
    rhs_expression = pcStack_108;
    lhs_expression = local_100;
    file = pcStack_f8;
    this_02 = pAStack_e8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xec7974);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xec7985);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_01);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xec79fe);
    testing::internal::AssertHelper::AssertHelper(this_02,type,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(local_178,pMStack_180);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xec7a61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xec7acc);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}